

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

void InitialEntropyCodesDistance
               (uint16_t *data,size_t length,size_t stride,size_t num_histograms,
               HistogramDistance *histograms)

{
  HistogramDistance *__s;
  ulong local_90;
  size_t pos;
  size_t i;
  size_t block_length;
  uint seed;
  HistogramDistance *histograms_local;
  size_t num_histograms_local;
  size_t stride_local;
  size_t length_local;
  uint16_t *data_local;
  ulong local_40;
  size_t i_1;
  long local_28;
  ushort *local_20;
  
  block_length._4_4_ = 7;
  for (local_40 = 0; local_40 < num_histograms; local_40 = local_40 + 1) {
    __s = histograms + local_40;
    memset(__s,0,0x820);
    __s->total_count_ = 0;
    __s->bit_cost_ = INFINITY;
  }
  for (pos = 0; pos < num_histograms; pos = pos + 1) {
    local_90 = (length * pos) / num_histograms;
    if (pos != 0) {
      if (block_length._4_4_ == 0) {
        block_length._4_4_ = 1;
      }
      local_90 = (ulong)block_length._4_4_ % (length / num_histograms) + local_90;
    }
    if (length <= local_90 + stride) {
      local_90 = (length - stride) - 1;
    }
    histograms[pos].total_count_ = stride + histograms[pos].total_count_;
    local_28 = stride + 1;
    local_20 = data + local_90;
    while (local_28 = local_28 + -1, local_28 != 0) {
      histograms[pos].data_[*local_20] = histograms[pos].data_[*local_20] + 1;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

static void FN(InitialEntropyCodes)(const DataType* data, size_t length,
                                    size_t stride,
                                    size_t num_histograms,
                                    HistogramType* histograms) {
  unsigned int seed = 7;
  size_t block_length = length / num_histograms;
  size_t i;
  FN(ClearHistograms)(histograms, num_histograms);
  for (i = 0; i < num_histograms; ++i) {
    size_t pos = length * i / num_histograms;
    if (i != 0) {
      pos += MyRand(&seed) % block_length;
    }
    if (pos + stride >= length) {
      pos = length - stride - 1;
    }
    FN(HistogramAddVector)(&histograms[i], data + pos, stride);
  }
}